

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

void __thiscall
lzham::search_accelerator::find_all_matches_callback
          (search_accelerator *this,uint64 data,void *pData_ptr)

{
  byte *pbVar1;
  atomic32_t *paVar2;
  byte bVar3;
  uint dist;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  node *pnVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  uchar *puVar20;
  uchar *puVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  dict_match *local_5c0;
  node *local_5b0;
  node *local_5a8;
  uint compMatchOfs;
  uint compMatchSlot;
  uint bestMatchSlotOfs;
  uint bestMatchSlot;
  uchar *local_558;
  uint64 local_550;
  ulong local_548;
  ulong local_540;
  dict_match temp_matches [256];
  
  uVar6 = this->m_fill_lookahead_pos;
  uVar22 = this->m_fill_lookahead_size;
  if (uVar22 < 2) {
    puVar21 = (this->m_dict).m_p;
    uVar11 = 0;
    uVar5 = 0;
  }
  else {
    uVar11 = this->m_max_dict_size_mask & uVar6;
    puVar21 = (this->m_dict).m_p;
    uVar5 = (uint)puVar21[uVar11];
    uVar11 = (uint)puVar21[uVar11 + 1];
  }
  uVar23 = this->m_fill_dict_size;
  uVar16 = uVar22;
  local_558 = puVar21;
  local_550 = data;
  do {
    uVar10 = 2;
    uVar18 = (ulong)uVar6;
    uVar12 = 0x101;
    if (uVar16 < 0x101) {
      uVar12 = uVar16;
    }
    if (uVar16 < 3) {
      uVar6 = 2;
      if (uVar22 < 2) {
        uVar6 = uVar22;
      }
      while (uVar6 != 0) {
        uVar22 = (uint)uVar18;
        pnVar9 = (this->m_nodes).m_p + (this->m_max_dict_size_mask & uVar22);
        pnVar9->m_left = 0;
        pnVar9->m_right = 0;
        LOCK();
        (this->m_match_refs).m_p[uVar22 - this->m_fill_lookahead_pos] = -2;
        UNLOCK();
        uVar18 = (ulong)(uVar22 + 1);
        uVar6 = uVar6 - 1;
      }
      LOCK();
      this->m_num_completed_helper_threads = this->m_num_completed_helper_threads + 1;
      UNLOCK();
      return;
    }
    uVar25 = this->m_max_dict_size_mask & uVar6;
    uVar14 = (ulong)uVar25;
    bVar3 = puVar21[uVar25 + 2];
    uVar5 = (uint)bVar3 << 4 ^ (uVar11 << 8 | uVar5);
    if (((this->m_hash_thread_index).m_size == 0) ||
       ((this->m_hash_thread_index).m_p[uVar5] == (uint)local_550)) {
      puVar4 = (this->m_hash).m_p;
      uVar25 = puVar4[uVar5];
      puVar4[uVar5] = uVar6;
      pnVar9 = (this->m_nodes).m_p;
      local_5b0 = pnVar9 + uVar14;
      local_5a8 = (node *)&pnVar9[uVar14].m_right;
      uVar24 = 0x101;
      if (uVar16 < 0x101) {
        uVar24 = (ulong)uVar16;
      }
      uVar13 = this->m_max_probes;
      local_5c0 = temp_matches;
      puVar19 = puVar21;
      local_548 = uVar14;
      do {
        bVar27 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        puVar20 = puVar19;
        if (((bVar27) || ((uint)uVar18 == uVar25)) ||
           (uVar6 = (uint)uVar18 - uVar25, uVar23 <= uVar6)) {
          local_5b0->m_left = 0;
          uVar13 = 0;
LAB_0010f0ff:
          local_5a8->m_left = uVar13;
          break;
        }
        uVar17 = (ulong)(this->m_max_dict_size_mask & uVar25);
        pnVar9 = (this->m_nodes).m_p + uVar17;
        uVar5 = 0;
        for (lVar7 = 0;
            (puVar19 + lVar7 + uVar17 < puVar19 + uVar24 + uVar17 + -7 &&
            (*(long *)(puVar19 + lVar7 + uVar17) == *(long *)(puVar21 + lVar7 + uVar14)));
            lVar7 = lVar7 + 8) {
          uVar5 = uVar5 + 8;
        }
        uVar8 = (ulong)uVar5;
        for (lVar26 = 0;
            (lVar26 + uVar8 < uVar24 &&
            (puVar19[lVar26 + uVar8 + uVar17] == puVar21[lVar26 + uVar8 + uVar14]));
            lVar26 = lVar26 + 1) {
        }
        uVar15 = (uint)uVar10;
        uVar5 = (uint)(lVar7 + lVar26);
        if (uVar15 < uVar5) {
          local_5c0->m_len = (char)lVar7 + (char)lVar26 + 0xfe;
          local_5c0->m_dist = uVar6;
          local_5c0 = local_5c0 + 1;
          if (uVar5 == uVar12) {
            local_5b0->m_left = pnVar9->m_left;
            uVar13 = pnVar9->m_right;
            goto LAB_0010f0ff;
          }
          uVar10 = lVar7 + lVar26 & 0xffffffff;
        }
        else if (this->m_all_matches == true) {
          local_5c0->m_len = (char)lVar7 + (char)lVar26 + 0xfe;
          local_5c0->m_dist = uVar6;
          local_5c0 = local_5c0 + 1;
        }
        else if (uVar15 < 3) {
          uVar10 = 2;
        }
        else if (uVar5 == uVar15) {
          dist = local_5c0[-1].m_dist;
          local_540 = uVar18;
          CLZBase::compute_lzx_position_slot(this->m_pLZBase,dist,&bestMatchSlot,&bestMatchSlotOfs);
          CLZBase::compute_lzx_position_slot(this->m_pLZBase,uVar6,&compMatchSlot,&compMatchOfs);
          puVar20 = local_558;
          uVar18 = local_540;
          if (((compMatchSlot < bestMatchSlot) ||
              ((compMatchSlot == bestMatchSlot && 7 < compMatchSlot &&
               ((compMatchOfs & 0xf) < (bestMatchSlotOfs & 0xf))))) ||
             ((compMatchSlot <= bestMatchSlot && lVar26 + uVar8 < uVar24 &&
              ((byte)g_hamming_dist[puVar21[uVar10 + uVar14] ^ puVar19[uVar10 + uVar17]] <
               (byte)g_hamming_dist
                     [local_558[((int)local_548 + uVar15) - dist & this->m_max_dict_size_mask] ^
                      puVar21[uVar10 + uVar14]])))) {
            local_5c0[-1].m_dist = uVar6;
          }
        }
        uVar8 = uVar8 + lVar26 & 0xffffffff;
        if (puVar19[uVar8 + uVar17] < puVar21[uVar8 + uVar14]) {
          local_5b0->m_left = uVar25;
          pnVar9 = (node *)&pnVar9->m_right;
          local_5b0 = pnVar9;
        }
        else {
          local_5a8->m_left = uVar25;
          local_5a8 = pnVar9;
        }
        bVar27 = pnVar9->m_left != uVar25;
        puVar19 = puVar20;
        uVar25 = pnVar9->m_left;
      } while (bVar27);
      uVar6 = (uint)uVar18;
      uVar10 = ((long)local_5c0 - (long)temp_matches) / 5;
      uVar18 = 0xfffffffffffffffe;
      uVar5 = (uint)uVar10;
      puVar21 = puVar20;
      if (uVar5 != 0) {
        pbVar1 = (byte *)((long)&local_5c0[-1].m_dist + 3);
        *pbVar1 = *pbVar1 | 0x80;
        uVar14 = (ulong)this->m_max_matches;
        if (uVar5 <= this->m_max_matches) {
          uVar14 = uVar10 & 0xffffffff;
        }
        LOCK();
        paVar2 = &this->m_next_match_ref;
        uVar18 = *paVar2;
        *paVar2 = *paVar2 + uVar14;
        UNLOCK();
        uVar18 = uVar18 & 0xffffffff;
        memcpy((this->m_matches).m_p + uVar18,temp_matches + (uVar5 - (int)uVar14),uVar14 * 5);
        puVar21 = local_558;
      }
      LOCK();
      (this->m_match_refs).m_p[uVar6 - this->m_fill_lookahead_pos] = uVar18;
      UNLOCK();
    }
    uVar6 = uVar6 + 1;
    uVar23 = uVar23 + 1;
    uVar16 = uVar16 - 1;
    uVar5 = uVar11;
    uVar11 = (uint)bVar3;
  } while( true );
}

Assistant:

void search_accelerator::find_all_matches_callback(uint64 data, void* pData_ptr)
   {
      scoped_perf_section find_all_matches_timer("find_all_matches_callback");

      pData_ptr;
      const uint thread_index = (uint)data;

      dict_match temp_matches[cMatchAccelMaxSupportedProbes * 2];

      uint fill_lookahead_pos = m_fill_lookahead_pos;
      uint fill_dict_size = m_fill_dict_size;
      uint fill_lookahead_size = m_fill_lookahead_size;

      uint c0 = 0, c1 = 0;
      if (fill_lookahead_size >= 2)
      {
         c0 = m_dict[fill_lookahead_pos & m_max_dict_size_mask];
         c1 = m_dict[(fill_lookahead_pos & m_max_dict_size_mask) + 1];
      }

      const uint8* pDict = m_dict.get_ptr();

      while (fill_lookahead_size >= 3)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;

         uint c2 = pDict[insert_pos + 2];
         uint h = hash3_to_16(c0, c1, c2);
         c0 = c1;
         c1 = c2;

         LZHAM_ASSERT(!m_hash_thread_index.size() || (m_hash_thread_index[h] != UINT8_MAX));

         // Only process those strings that this worker thread was assigned to - this allows us to manipulate multiple trees in parallel with no worries about synchronization.
         if (m_hash_thread_index.size() && (m_hash_thread_index[h] != thread_index))
         {
            fill_lookahead_pos++;
            fill_lookahead_size--;
            fill_dict_size++;
            continue;
         }

         dict_match* pDstMatch = temp_matches;

         uint cur_pos = m_hash[h];
         m_hash[h] = static_cast<uint>(fill_lookahead_pos);

         uint *pLeft = &m_nodes[insert_pos].m_left;
         uint *pRight = &m_nodes[insert_pos].m_right;

         const uint max_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, fill_lookahead_size);
         uint best_match_len = 2;

         const uint8* pIns = &pDict[insert_pos];

         uint n = m_max_probes;
         for ( ; ; )
         {
            uint delta_pos = fill_lookahead_pos - cur_pos;
            if ((n-- == 0) || (!delta_pos) || (delta_pos >= fill_dict_size))
            {
               *pLeft = 0;
               *pRight = 0;
               break;
            }

            uint pos = cur_pos & m_max_dict_size_mask;
            node *pNode = &m_nodes[pos];

            // Unfortunately, the initial compare match_len must be 2 because of the way we truncate matches at the end of each block.
            uint match_len = 0;
            const uint8* pComp = &pDict[pos];

#if LZHAM_PLATFORM_X360
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
#else
            // Compare a qword at a time for a bit more efficiency.
            const uint64* pComp_end = reinterpret_cast<const uint64*>(pComp + max_match_len - 7);
            const uint64* pComp_cur = reinterpret_cast<const uint64*>(pComp);
            const uint64* pIns_cur = reinterpret_cast<const uint64*>(pIns);
            while (pComp_cur < pComp_end)
            {
               if (*pComp_cur != *pIns_cur)
                  break;
               pComp_cur++;
               pIns_cur++;
            }
            uint alt_match_len = static_cast<uint>(reinterpret_cast<const uint8*>(pComp_cur) - reinterpret_cast<const uint8*>(pComp));
            for ( ; alt_match_len < max_match_len; alt_match_len++)
               if (pComp[alt_match_len] != pIns[alt_match_len])
                  break;
#ifdef LZVERIFY
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
            LZHAM_VERIFY(alt_match_len == match_len);
#endif
            match_len = alt_match_len;
#endif

            if (match_len > best_match_len)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;

               best_match_len = match_len;

               if (match_len == max_match_len)
               {
                  *pLeft = pNode->m_left;
                  *pRight = pNode->m_right;
                  break;
               }
            }
            else if (m_all_matches)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;
            }
            else if ((best_match_len > 2) && (best_match_len == match_len))
            {
               uint bestMatchDist = pDstMatch[-1].m_dist;
               uint compMatchDist = delta_pos;

               uint bestMatchSlot, bestMatchSlotOfs;
               m_pLZBase->compute_lzx_position_slot(bestMatchDist, bestMatchSlot, bestMatchSlotOfs);

               uint compMatchSlot, compMatchOfs;
               m_pLZBase->compute_lzx_position_slot(compMatchDist, compMatchSlot, compMatchOfs);

               // If both matches uses the same match slot, choose the one with the offset containing the lowest nibble as these bits separately entropy coded.
               // This could choose a match which is further away in the absolute sense, but closer in a coding sense.
               if ( (compMatchSlot < bestMatchSlot) ||
                  ((compMatchSlot >= 8) && (compMatchSlot == bestMatchSlot) && ((compMatchOfs & 15) < (bestMatchSlotOfs & 15))) )
               {
                  LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                  pDstMatch[-1].m_dist = delta_pos;
               }
               else if ((match_len < max_match_len) && (compMatchSlot <= bestMatchSlot))
               {
                  // Choose the match which has lowest hamming distance in the mismatch byte for a tiny win on binary files.
                  // TODO: This competes against the prev. optimization.
                  uint desired_mismatch_byte = pIns[match_len];

                  uint cur_mismatch_byte = pDict[(insert_pos - bestMatchDist + match_len) & m_max_dict_size_mask];
                  uint cur_mismatch_dist = g_hamming_dist[cur_mismatch_byte ^ desired_mismatch_byte];

                  uint new_mismatch_byte = pComp[match_len];
                  uint new_mismatch_dist = g_hamming_dist[new_mismatch_byte ^ desired_mismatch_byte];
                  if (new_mismatch_dist < cur_mismatch_dist)
                  {
                     LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                     pDstMatch[-1].m_dist = delta_pos;
                  }
               }
            }

            uint new_pos;
            if (pComp[match_len] < pIns[match_len])
            {
               *pLeft = cur_pos;
               pLeft = &pNode->m_right;
               new_pos = pNode->m_right;
            }
            else
            {
               *pRight = cur_pos;
               pRight = &pNode->m_left;
               new_pos = pNode->m_left;
            }
            if (new_pos == cur_pos)
               break;
            cur_pos = new_pos;
         }

         const uint num_matches = (uint)(pDstMatch - temp_matches);

         if (num_matches)
         {
            pDstMatch[-1].m_dist |= 0x80000000;

            const uint num_matches_to_write = LZHAM_MIN(num_matches, m_max_matches);

            const uint match_ref_ofs = atomic_exchange_add(&m_next_match_ref, num_matches_to_write);

            memcpy(&m_matches[match_ref_ofs],
                   temp_matches + (num_matches - num_matches_to_write),
                   sizeof(temp_matches[0]) * num_matches_to_write);

            // FIXME: This is going to really hurt on platforms requiring export barriers.
            LZHAM_MEMORY_EXPORT_BARRIER

            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], match_ref_ofs);
         }
         else
         {
            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);
         }

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }

      while (fill_lookahead_size)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
         m_nodes[insert_pos].m_left = 0;
         m_nodes[insert_pos].m_right = 0;

         atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }
      
      atomic_increment32(&m_num_completed_helper_threads);
   }